

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void std::
     __insertion_sort<QList<QString>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QtPrivate::QStringList_sort(QList<QString>*,Qt::CaseSensitivity)::__0>>
               (iterator __first,QString *__last)

{
  Data *pDVar1;
  QArrayData *data;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  iterator __last_00;
  
  if (__first.i != __last) {
    for (__last_00.i = __first.i + 1; __last_00.i != __last; __last_00.i = __last_00.i + 1) {
      iVar4 = QString::compare(__last_00.i,__first.i,CaseInsensitive);
      if (iVar4 < 0) {
        pDVar1 = ((__last_00.i)->d).d;
        pcVar2 = ((__last_00.i)->d).ptr;
        qVar3 = ((__last_00.i)->d).size;
        ((__last_00.i)->d).d = (Data *)0x0;
        ((__last_00.i)->d).ptr = (char16_t *)0x0;
        ((__last_00.i)->d).size = 0;
        __copy_move_backward<true,false,std::random_access_iterator_tag>::
        __copy_move_b<QList<QString>::iterator,QList<QString>::iterator>
                  (__first,__last_00,__last_00.i + 1);
        data = &(((__first.i)->d).d)->super_QArrayData;
        ((__first.i)->d).d = pDVar1;
        ((__first.i)->d).ptr = pcVar2;
        ((__first.i)->d).size = qVar3;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,2,0x10);
          }
        }
      }
      else {
        __unguarded_linear_insert<QList<QString>::iterator,__gnu_cxx::__ops::_Val_comp_iter<QtPrivate::QStringList_sort(QList<QString>*,Qt::CaseSensitivity)::__0>>
                  (__last_00.i);
      }
    }
  }
  return;
}

Assistant:

inline constexpr bool operator!=(iterator o) const { return i != o.i; }